

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> __thiscall
Parser::parseBlockStmt(Parser *this)

{
  Parser *in_RSI;
  undefined1 local_38 [16];
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  statements;
  Parser *this_local;
  
  eatToken(in_RSI,LeftBrace);
  std::
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ::vector((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
            *)(local_38 + 8));
  while ((in_RSI->m_currToken).type != RightBrace) {
    parseStmt((Parser *)local_38);
    std::
    vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
    ::push_back((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
                 *)(local_38 + 8),(value_type *)local_38);
    std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>::~unique_ptr
              ((unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_38);
    eatToken(in_RSI,EOL);
  }
  eatToken(in_RSI,RightBrace);
  std::
  make_unique<AST::BlockStmt,std::vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>>
            ((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
              *)this);
  std::
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
             *)(local_38 + 8));
  return (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)
         (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::BlockStmt> Parser::parseBlockStmt() {
    eatToken(TokenType::LeftBrace);
    std::vector<std::unique_ptr<AST::Stmt>> statements;
    while (m_currToken.type != TokenType::RightBrace) {
        statements.push_back(parseStmt());
        eatToken(TokenType::EOL);
    }
    eatToken(TokenType::RightBrace);
    return std::make_unique<AST::BlockStmt>(std::move(statements));
}